

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O1

void __thiscall
Fixpp::result::Result<void,_Fixpp::ErrorKind>::Result
          (Result<void,_Fixpp::ErrorKind> *this,Err<Fixpp::ErrorKind> *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  size_type *local_38;
  size_type local_28;
  undefined8 uStack_20;
  
  this->ok_ = false;
  local_38 = (size_type *)(err->val).str_._M_dataplus._M_p;
  paVar1 = &(err->val).str_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38 == paVar1) {
    local_28 = paVar1->_M_allocated_capacity;
    uStack_20 = *(undefined8 *)((long)&(err->val).str_.field_2 + 8);
    local_38 = &local_28;
  }
  else {
    local_28 = paVar1->_M_allocated_capacity;
  }
  sVar2 = (err->val).str_._M_string_length;
  (err->val).str_._M_dataplus._M_p = (pointer)paVar1;
  (err->val).str_._M_string_length = 0;
  (err->val).str_.field_2._M_local_buf[0] = '\0';
  uVar3 = *(undefined4 *)&(err->val).field_0x4;
  sVar5 = (err->val).column_;
  uVar4 = *(undefined4 *)((long)&(err->val).column_ + 4);
  *(Type *)&(this->storage_).storage_ = (err->val).type_;
  *(undefined4 *)((long)&(this->storage_).storage_ + 4) = uVar3;
  *(int *)((long)&(this->storage_).storage_ + 8) = (int)sVar5;
  *(undefined4 *)((long)&(this->storage_).storage_ + 0xc) = uVar4;
  *(undefined1 **)((long)&(this->storage_).storage_ + 0x10) =
       (undefined1 *)((long)&(this->storage_).storage_ + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&(this->storage_).storage_ + 0x10),local_38,sVar2 + (long)local_38);
  (this->storage_).initialized_ = true;
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  return;
}

Assistant:

Result(types::Err<E> err)
        : ok_(false)
    {
        storage_.construct(std::move(err));
    }